

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

int Gem_GroupVarRemove(int Groups,int i)

{
  uint uVar1;
  
  if (i == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0xffffffff >> (-(char)i & 0x1fU);
    if (i < 0) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                    ,0xa1,"int Gem_GroupVarRemove(int, int)");
    }
  }
  if (((uint)Groups >> (i & 0x1fU) & 1) != 0) {
    return (int)(~uVar1 & Groups) >> 1 | uVar1 & Groups;
  }
  __assert_fail("(Groups >> i) & 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                ,0xa2,"int Gem_GroupVarRemove(int, int)");
}

Assistant:

int Gem_GroupVarRemove( int Groups, int i ) // remove i-th var
{
    int Mask = i ? Abc_InfoMask( i ) : 0;
    assert( i >= 0 );
    assert( (Groups >> i) & 1 );
    return (Groups & Mask) | ((Groups & ~Mask) >> 1);
}